

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnFuncType
          (BinaryReaderIR *this,Index index,Index param_count,Type *param_types,Index result_count,
          Type *result_types)

{
  long *plVar1;
  undefined8 uVar2;
  undefined1 local_60 [48];
  
  GetLocation((Location *)(local_60 + 0x10),this);
  std::make_unique<wabt::TypeModuleField,wabt::Location>((Location *)local_60);
  std::make_unique<wabt::FuncType>();
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)(local_60._16_8_ + 0x50),param_types,
             param_types + param_count);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)(local_60._16_8_ + 0x68),result_types,
             result_types + result_count);
  uVar2 = local_60._16_8_;
  local_60._16_8_ = 0;
  plVar1 = *(long **)(local_60._0_8_ + 0x40);
  ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)(local_60._0_8_ + 0x40)
  )->offset = uVar2;
  local_60._8_8_ = local_60._0_8_;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
    local_60._8_8_ = local_60._0_8_;
  }
  local_60._0_8_ = (long *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)(local_60 + 8));
  if ((long *)local_60._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_60._8_8_ + 8))();
  }
  local_60._8_8_ = (char *)0x0;
  if (local_60._16_8_ != 0) {
    (**(code **)(*(long *)local_60._16_8_ + 8))();
  }
  if ((long *)local_60._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_60._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnFuncType(Index index,
                                  Index param_count,
                                  Type* param_types,
                                  Index result_count,
                                  Type* result_types) {
  auto field = std::make_unique<TypeModuleField>(GetLocation());
  auto func_type = std::make_unique<FuncType>();
  func_type->sig.param_types.assign(param_types, param_types + param_count);
  func_type->sig.result_types.assign(result_types, result_types + result_count);
  field->type = std::move(func_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}